

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml2-py.c
# Opt level: O0

PyObject * libxml_xmlValidateDtdFinal(PyObject *self,PyObject *args)

{
  int iVar1;
  PyObject *local_60;
  PyObject *local_58;
  undefined *local_50;
  PyObject *pyobj_doc;
  xmlDocPtr doc;
  PyObject *pyobj_ctxt;
  xmlValidCtxtPtr ctxt;
  int c_retval;
  PyObject *py_retval;
  PyObject *args_local;
  PyObject *self_local;
  
  py_retval = args;
  args_local = self;
  iVar1 = libxml_deprecationWarning("xmlValidateDtdFinal");
  if (iVar1 == -1) {
    self_local = (PyObject *)0x0;
  }
  else {
    iVar1 = _PyArg_ParseTuple_SizeT(py_retval,"OO:xmlValidateDtdFinal",&doc,&local_50);
    if (iVar1 == 0) {
      self_local = (PyObject *)0x0;
    }
    else {
      if (doc == (xmlDocPtr)&_Py_NoneStruct) {
        local_58 = (PyObject *)0x0;
      }
      else {
        local_58 = (PyObject *)doc->name;
      }
      pyobj_ctxt = local_58;
      if (local_50 == &_Py_NoneStruct) {
        local_60 = (PyObject *)0x0;
      }
      else {
        local_60 = *(PyObject **)(local_50 + 0x10);
      }
      pyobj_doc = local_60;
      ctxt._4_4_ = xmlValidateDtdFinal(local_58,local_60);
      self_local = libxml_intWrap(ctxt._4_4_);
    }
  }
  return self_local;
}

Assistant:

XML_IGNORE_DEPRECATION_WARNINGS
PyObject *
libxml_xmlValidateDtdFinal(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    PyObject *py_retval;
    int c_retval;
    xmlValidCtxtPtr ctxt;
    PyObject *pyobj_ctxt;
    xmlDocPtr doc;
    PyObject *pyobj_doc;

    if (libxml_deprecationWarning("xmlValidateDtdFinal") == -1)
        return(NULL);

    if (!PyArg_ParseTuple(args, (char *)"OO:xmlValidateDtdFinal", &pyobj_ctxt, &pyobj_doc))
        return(NULL);
    ctxt = (xmlValidCtxtPtr) PyValidCtxt_Get(pyobj_ctxt);
    doc = (xmlDocPtr) PyxmlNode_Get(pyobj_doc);

    c_retval = xmlValidateDtdFinal(ctxt, doc);
    py_retval = libxml_intWrap((int) c_retval);
    return(py_retval);
}